

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

ostream * util::math::internal_vector::operator<<(ostream *out,D *v)

{
  double dVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"",0);
  dVar1 = BasicVector<Vector2,_double,_2UL>::operator[]((BasicVector<Vector2,_double,_2UL> *)v,0);
  std::ostream::_M_insert<double>(dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  dVar1 = BasicVector<Vector2,_double,_2UL>::operator[]((BasicVector<Vector2,_double,_2UL> *)v,1);
  std::ostream::_M_insert<double>(dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const D& v) {
    out << "[";
    const char *sep = "";
    for (int i = 0; i < SIZE; ++i) {
      out << sep;
      Print(out, v[i]);
      sep = ", ";
    }
    return out << "]";
  }